

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unfounded_check.cpp
# Opt level: O0

bool __thiscall
Clasp::DefaultUnfoundedCheck::isExternal(DefaultUnfoundedCheck *this,BodyPtr *n,weight_t *S)

{
  bool bVar1;
  const_reference pAVar2;
  int *in_RDX;
  undefined8 *in_RSI;
  long in_RDI;
  NodeId *x_1;
  NodeId *x;
  NodeId in_stack_ffffffffffffff9c;
  PrgDepGraph *in_stack_ffffffffffffffa0;
  undefined7 in_stack_ffffffffffffffa8;
  undefined1 in_stack_ffffffffffffffaf;
  undefined1 uVar3;
  undefined8 in_stack_ffffffffffffffb0;
  Literal p;
  size_type *local_30;
  size_type *local_20;
  
  bVar1 = Asp::PrgDepGraph::BodyNode::sum((BodyNode *)*in_RSI);
  if (bVar1) {
    local_30 = Asp::PrgDepGraph::BodyNode::preds((BodyNode *)*in_RSI);
    while( true ) {
      uVar3 = false;
      if (*local_30 != 0xffffffff) {
        uVar3 = -1 < *in_RDX;
      }
      if ((bool)uVar3 == false) break;
      pAVar2 = bk_lib::
               pod_vector<Clasp::DefaultUnfoundedCheck::AtomData,_std::allocator<Clasp::DefaultUnfoundedCheck::AtomData>_>
               ::operator[]((pod_vector<Clasp::DefaultUnfoundedCheck::AtomData,_std::allocator<Clasp::DefaultUnfoundedCheck::AtomData>_>
                             *)(in_RDI + 0x28),*local_30);
      if (((uint)*pAVar2 >> 0x1e & 1) != 0) {
        Asp::PrgDepGraph::getAtom(*(PrgDepGraph **)(in_RDI + 0x10),in_stack_ffffffffffffff9c);
        bVar1 = Solver::isFalse((Solver *)CONCAT17(uVar3,in_stack_ffffffffffffffa8),
                                (Literal)(uint32)((ulong)in_stack_ffffffffffffffb0 >> 0x20));
        if (!bVar1) {
          *in_RDX = *in_RDX - local_30[1];
        }
      }
      local_30 = local_30 + 2;
    }
  }
  else {
    local_20 = Asp::PrgDepGraph::BodyNode::preds((BodyNode *)*in_RSI);
    while( true ) {
      bVar1 = false;
      if (*local_20 != 0xffffffff) {
        bVar1 = -1 < *in_RDX;
      }
      if (!bVar1) break;
      pAVar2 = bk_lib::
               pod_vector<Clasp::DefaultUnfoundedCheck::AtomData,_std::allocator<Clasp::DefaultUnfoundedCheck::AtomData>_>
               ::operator[]((pod_vector<Clasp::DefaultUnfoundedCheck::AtomData,_std::allocator<Clasp::DefaultUnfoundedCheck::AtomData>_>
                             *)(in_RDI + 0x28),*local_20);
      if (((uint)*pAVar2 >> 0x1e & 1) != 0) {
        p.rep_ = (uint32)((ulong)*(undefined8 *)(in_RDI + 0x10) >> 0x20);
        Asp::PrgDepGraph::getAtom(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
        bVar1 = Solver::isFalse((Solver *)
                                CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8),p);
        if (!bVar1) {
          *in_RDX = *in_RDX + -1;
        }
      }
      local_20 = local_20 + 1;
    }
  }
  return -1 < *in_RDX;
}

Assistant:

bool DefaultUnfoundedCheck::isExternal(const BodyPtr& n, weight_t& S) const {
#define IN_UFS(id) ( (atoms_[(id)].ufs) && !solver_->isFalse(graph_->getAtom((id)).lit) )
	if (!n.node->sum()) {
		for (const NodeId* x = n.node->preds(); *x != idMax && S >= 0; ++x) {
			if (IN_UFS(*x)) { S -= 1; }
		}
	}
	else {
		for (const NodeId* x = n.node->preds(); *x != idMax && S >= 0; x+=2) {
			if (IN_UFS(*x)) { S -= static_cast<weight_t>(x[1]); }
		}
	}
	return S >= 0;
#undef IN_UFS
}